

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP4Serializer::PutProcessGroupIndex
          (BP4Serializer *this,string *ioName,string *hostLanguage,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *transportsTypes)

{
  const_iterator __position;
  bool bVar1;
  undefined1 uVar2;
  size_type sVar3;
  reference puVar4;
  string *in_RDX;
  string *in_RSI;
  long *in_RDI;
  uchar methodID;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  uint16_t methodsLength;
  uint8_t methodsCount;
  vector<unsigned_char,_std::allocator<unsigned_char>_> methodIDs;
  size_t backPosition;
  uint16_t metadataPGIndexLength;
  string timeStepName;
  uint32_t processID;
  char columnMajor;
  size_t metadataPGLengthPosition;
  char pgi [5];
  size_t pgBeginPosition;
  size_t *dataPosition;
  vector<char,_std::allocator<char>_> *dataBuffer;
  vector<char,_std::allocator<char>_> *metadataBuffer;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd78;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  string *in_stack_fffffffffffffd90;
  string *this_00;
  size_t *in_stack_fffffffffffffd98;
  size_t *position;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  vector<char,_std::allocator<char>_> *buffer;
  string *in_stack_fffffffffffffda8;
  string *name;
  BPSerializer *in_stack_fffffffffffffdb0;
  BPSerializer *this_01;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  IOChrono *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *transportsTypes_00;
  BPBase *this_03;
  allocator local_1d9;
  string local_1d8 [39];
  uchar local_1b1;
  uchar *local_1b0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1a0;
  short local_194;
  byte local_191;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  size_type local_178;
  short local_16a;
  string *in_stack_fffffffffffffe98;
  IOChrono *in_stack_fffffffffffffea0;
  string local_148 [32];
  string local_128 [36];
  undefined4 local_104;
  string local_100;
  undefined1 local_e0 [40];
  string local_b8 [32];
  char *local_98;
  undefined1 local_89;
  char *local_88;
  size_type local_78;
  undefined4 local_70;
  undefined1 local_6c;
  long local_68;
  long *local_60;
  long local_58;
  vector<char,_std::allocator<char>_> *local_50;
  allocator local_41;
  string *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,"buffering",&local_41);
  this_03 = (BPBase *)&stack0xffffffffffffffc0;
  profiling::IOChrono::Start(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::__cxx11::string::~string((string *)this_03);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_50 = (vector<char,_std::allocator<char>_> *)
             ((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8);
  local_58 = (long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x70;
  local_60 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x60);
  local_68 = *local_60;
  local_6c = 0;
  local_70 = 0x4947505b;
  helper::CopyToBuffer<char>
            (in_stack_fffffffffffffdc0,
             (size_t *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),
             (char *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8);
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a8) = *local_60;
  *local_60 = *local_60 + 8;
  local_78 = std::vector<char,_std::allocator<char>_>::size(local_50);
  local_88 = (char *)std::vector<char,_std::allocator<char>_>::end(in_stack_fffffffffffffd78);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
             in_stack_fffffffffffffd80,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
             in_stack_fffffffffffffd78);
  local_89 = 0;
  __position._M_current._7_1_ = in_stack_fffffffffffffdbf;
  __position._M_current._0_7_ = in_stack_fffffffffffffdb8;
  local_98 = (char *)std::vector<char,_std::allocator<char>_>::insert
                               ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffdb0,
                                __position,(size_type)in_stack_fffffffffffffda8,
                                (value_type_conflict3 *)in_stack_fffffffffffffda0);
  transportsTypes_00 =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)(in_RDI + 0x14);
  std::__cxx11::string::string(local_b8,local_10);
  BPSerializer::PutNameRecord
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::string((string *)local_e0,in_RDX);
  this_01 = (BPSerializer *)local_e0;
  bVar1 = helper::IsRowMajor(in_stack_fffffffffffffd90);
  uVar2 = 0x79;
  if (bVar1) {
    uVar2 = 0x6e;
  }
  std::__cxx11::string::~string((string *)this_01);
  this_02 = (IOChrono *)(local_e0 + 0x27);
  local_e0[0x27] = uVar2;
  helper::InsertToBuffer<char>
            ((vector<char,_std::allocator<char>_> *)this_01,(char *)in_stack_fffffffffffffda8,
             (size_t)in_stack_fffffffffffffda0);
  helper::CopyToBuffer<char>
            ((vector<char,_std::allocator<char>_> *)this_02,
             (size_t *)CONCAT17(uVar2,in_stack_fffffffffffffdb8),(char *)this_01,
             (size_t)in_stack_fffffffffffffda8);
  std::__cxx11::string::string((string *)&local_100,local_10);
  name = &local_100;
  BPSerializer::PutNameRecord(this_01,name,in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  std::__cxx11::string::~string((string *)name);
  local_104 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10);
  helper::InsertToBuffer<unsigned_int>
            ((vector<char,_std::allocator<char>_> *)this_01,(uint *)name,
             (size_t)in_stack_fffffffffffffda0);
  *local_60 = *local_60 + 4;
  std::__cxx11::to_string((uint)((ulong)name >> 0x20));
  buffer = (vector<char,_std::allocator<char>_> *)(in_RDI + 0x14);
  std::__cxx11::string::string(local_148,local_128);
  this_00 = local_148;
  BPSerializer::PutNameRecord(this_01,name,buffer);
  std::__cxx11::string::~string(this_00);
  position = (size_t *)(in_RDI + 0x14);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe98,local_128);
  BPSerializer::PutNameRecord(this_01,name,buffer,position);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe98);
  helper::InsertToBuffer<unsigned_int>
            ((vector<char,_std::allocator<char>_> *)this_01,(uint *)name,(size_t)buffer);
  helper::CopyToBuffer<unsigned_int>
            ((vector<char,_std::allocator<char>_> *)this_02,
             (size_t *)CONCAT17(uVar2,in_stack_fffffffffffffdb8),(uint *)this_01,(size_t)name);
  helper::InsertU64<unsigned_long>
            (in_stack_fffffffffffffd80,(unsigned_long)in_stack_fffffffffffffd78);
  sVar3 = std::vector<char,_std::allocator<char>_>::size(local_50);
  local_16a = ((short)sVar3 - (short)local_78) + -2;
  local_178 = local_78;
  helper::CopyToBuffer<unsigned_short>
            ((vector<char,_std::allocator<char>_> *)this_02,
             (size_t *)CONCAT17(uVar2,in_stack_fffffffffffffdb8),(unsigned_short *)this_01,
             (size_t)name);
  BPBase::GetTransportIDs(this_03,transportsTypes_00);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_190);
  local_191 = (byte)sVar3;
  helper::CopyToBuffer<unsigned_char>
            ((vector<char,_std::allocator<char>_> *)this_02,
             (size_t *)CONCAT17(uVar2,in_stack_fffffffffffffdb8),(uchar *)this_01,(size_t)name);
  local_194 = (ushort)local_191 * 3;
  helper::CopyToBuffer<unsigned_short>
            ((vector<char,_std::allocator<char>_> *)this_02,
             (size_t *)CONCAT17(uVar2,in_stack_fffffffffffffdb8),(unsigned_short *)this_01,
             (size_t)name);
  local_1a0 = &local_190;
  local_1a8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffd78);
  local_1b0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  in_stack_fffffffffffffd78);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffd80,
                       (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffd78);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&local_1a8);
    local_1b1 = *puVar4;
    helper::CopyToBuffer<unsigned_char>
              ((vector<char,_std::allocator<char>_> *)this_02,
               (size_t *)CONCAT17(uVar2,in_stack_fffffffffffffdb8),(uchar *)this_01,(size_t)name);
    *local_60 = *local_60 + 2;
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_1a8);
  }
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x68) =
       *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x68) + (*local_60 - local_68);
  *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b0) = 0;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1b8) = *local_60;
  *local_60 = *local_60 + 0xc;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x68) =
       *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x68) + 0xc;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a0) =
       *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a0) + 1;
  *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0) = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"buffering",&local_1d9);
  profiling::IOChrono::Stop(this_02,(string *)CONCAT17(uVar2,in_stack_fffffffffffffdb8));
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::__cxx11::string::~string(local_128);
  return;
}

Assistant:

void BP4Serializer::PutProcessGroupIndex(const std::string &ioName, const std::string hostLanguage,
                                         const std::vector<std::string> &transportsTypes) noexcept
{
    m_Profiler.Start("buffering");
    std::vector<char> &metadataBuffer = m_MetadataSet.PGIndex.Buffer;

    std::vector<char> &dataBuffer = m_Data.m_Buffer;
    size_t &dataPosition = m_Data.m_Position;
    const size_t pgBeginPosition = dataPosition;

    // write a block identifier [PGI
    const char pgi[] = "[PGI"; //  don't write \0!
    helper::CopyToBuffer(dataBuffer, dataPosition, pgi, sizeof(pgi) - 1);

    m_MetadataSet.DataPGLengthPosition = dataPosition;
    dataPosition += 8; // skip pg length (8)

    const std::size_t metadataPGLengthPosition = metadataBuffer.size();
    metadataBuffer.insert(metadataBuffer.end(), 2, '\0'); // skip pg length (2)

    // write name to metadata
    PutNameRecord(ioName, metadataBuffer);

    // write if data is column major in metadata and data
    const char columnMajor = (helper::IsRowMajor(hostLanguage) == false) ? 'y' : 'n';
    helper::InsertToBuffer(metadataBuffer, &columnMajor);
    helper::CopyToBuffer(dataBuffer, dataPosition, &columnMajor);

    // write name in data
    PutNameRecord(ioName, dataBuffer, dataPosition);

    // processID in metadata,
    const uint32_t processID = static_cast<uint32_t>(m_RankMPI);
    helper::InsertToBuffer(metadataBuffer, &processID);
    // skip coordination var in data ....what is coordination var?
    dataPosition += 4;

    // time step name to metadata and data
    const std::string timeStepName(std::to_string(m_MetadataSet.TimeStep));
    PutNameRecord(timeStepName, metadataBuffer);
    PutNameRecord(timeStepName, dataBuffer, dataPosition);

    // time step to metadata and data
    helper::InsertToBuffer(metadataBuffer, &m_MetadataSet.TimeStep);
    helper::CopyToBuffer(dataBuffer, dataPosition, &m_MetadataSet.TimeStep);

    // offset to pg in data in metadata which is the current absolute position
    helper::InsertU64(metadataBuffer, m_Data.m_AbsolutePosition + m_PreDataFileLength);

    // Back to writing metadata pg index length (length of group)
    const uint16_t metadataPGIndexLength =
        static_cast<uint16_t>(metadataBuffer.size() - metadataPGLengthPosition - 2);

    size_t backPosition = metadataPGLengthPosition;
    helper::CopyToBuffer(metadataBuffer, backPosition, &metadataPGIndexLength);
    // DONE With metadataBuffer

    // here write method in data
    const std::vector<uint8_t> methodIDs = GetTransportIDs(transportsTypes);
    const uint8_t methodsCount = static_cast<uint8_t>(methodIDs.size());
    helper::CopyToBuffer(dataBuffer, dataPosition, &methodsCount); // count
    // methodID (1) + method params length(2), no parameters for now
    const uint16_t methodsLength = static_cast<uint16_t>(methodsCount * 3);

    helper::CopyToBuffer(dataBuffer, dataPosition, &methodsLength); // length

    for (const auto methodID : methodIDs)
    {
        helper::CopyToBuffer(dataBuffer, dataPosition, &methodID); // method ID,
        dataPosition += 2; // skip method params length = 0 (2 bytes) for now
    }

    // update absolute position
    m_Data.m_AbsolutePosition += dataPosition - pgBeginPosition;
    // pg vars count and position
    m_MetadataSet.DataPGVarsCount = 0;
    m_MetadataSet.DataPGVarsCountPosition = dataPosition;
    // add vars count and length
    dataPosition += 12;
    m_Data.m_AbsolutePosition += 12; // add vars count and length

    ++m_MetadataSet.DataPGCount;
    m_MetadataSet.DataPGIsOpen = true;

    m_Profiler.Stop("buffering");
}